

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O2

void sock_tests::recv_until_terminator_limit_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_690;
  pointer local_688;
  char *local_680;
  char *local_678;
  pointer local_670;
  pointer local_668;
  char *local_660;
  char *local_658;
  pointer local_650;
  pointer local_648;
  char *local_640;
  char *local_638;
  pointer local_630;
  pointer local_628;
  char *local_620;
  char *local_618;
  pointer local_610;
  pointer local_608;
  char *local_600;
  char *local_5f8;
  basic_wrap_stringstream<char> local_5f0;
  recv_until_terminator_limit t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_5f8 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"recv_until_terminator_limit");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_610 = (pbVar3->_M_dataplus)._M_p;
  local_608 = local_610 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x8f;
  file.m_begin = (iterator)&local_600;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_610,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  recv_until_terminator_limit::recv_until_terminator_limit(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_618 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"recv_until_terminator_limit");
  std::operator<<((ostream *)&local_5f0,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_630 = (pbVar3->_M_dataplus)._M_p;
  local_628 = local_630 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x8f;
  file_00.m_begin = (iterator)&local_620;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_630,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_638 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"recv_until_terminator_limit");
  std::operator<<((ostream *)&local_5f0,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_650 = (pbVar3->_M_dataplus)._M_p;
  local_648 = local_650 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x8f;
  file_01.m_begin = (iterator)&local_640;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_650,msg_01);
  this = &local_5f0;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  recv_until_terminator_limit::test_method((recv_until_terminator_limit *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_658 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"recv_until_terminator_limit");
  std::operator<<((ostream *)&local_5f0,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_670 = (pbVar3->_M_dataplus)._M_p;
  local_668 = local_670 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x8f;
  file_02.m_begin = (iterator)&local_660;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_670,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_678 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"recv_until_terminator_limit");
  std::operator<<((ostream *)&local_5f0,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_690 = (pbVar3->_M_dataplus)._M_p;
  local_688 = local_690 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x8f;
  file_03.m_begin = (iterator)&local_680;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_690,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  BasicTestingSetup::~BasicTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(recv_until_terminator_limit)
{
    constexpr auto timeout = 1min; // High enough so that it is never hit.
    CThreadInterrupt interrupt;
    int s[2];
    CreateSocketPair(s);

    Sock sock_send(s[0]);
    Sock sock_recv(s[1]);

    std::thread receiver([&sock_recv, &timeout, &interrupt]() {
        constexpr size_t max_data{10};
        bool threw_as_expected{false};
        // BOOST_CHECK_EXCEPTION() writes to some variables shared with the main thread which
        // creates a data race. So mimic it manually.
        try {
            (void)sock_recv.RecvUntilTerminator('\n', timeout, interrupt, max_data);
        } catch (const std::runtime_error& e) {
            threw_as_expected = HasReason("too many bytes without a terminator")(e);
        }
        assert(threw_as_expected);
    });

    BOOST_REQUIRE_NO_THROW(sock_send.SendComplete("1234567", timeout, interrupt));
    BOOST_REQUIRE_NO_THROW(sock_send.SendComplete("89a\n", timeout, interrupt));

    receiver.join();
}